

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Fd.cpp
# Opt level: O0

uint64_t __thiscall w3Fd::get_file_size(w3Fd *this,PCSTR file_name)

{
  int iVar1;
  PCSTR a;
  string local_c8;
  undefined1 local_a8 [8];
  stat64 st;
  PCSTR file_name_local;
  w3Fd *this_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)file_name;
  memset(local_a8,0,0x90);
  iVar1 = fstat64(this->fd,(stat64 *)local_a8);
  if (iVar1 != 0) {
    StringFormat_abi_cxx11_(&local_c8,"fstat (%s)",st.__glibc_reserved[2]);
    a = (PCSTR)std::__cxx11::string::c_str();
    ThrowErrno(a);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return st.st_rdev;
}

Assistant:

uint64_t w3Fd::get_file_size (PCSTR file_name)
{
#if __CYGWIN__
    struct stat st = { 0 }; // TODO test more systems
    if (fstat (fd, &st))
#else
    struct stat64 st = { 0 }; // TODO test more systems
    if (fstat64 (fd, &st))
#endif
        ThrowErrno (StringFormat ("fstat (%s)", file_name).c_str ());
    return st.st_size;
}